

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialSort.cpp
# Opt level: O1

uint __thiscall
Assimp::SpatialSort::GenerateMappingTable
          (SpatialSort *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *fill,
          ai_real pRadius)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  pointer pEVar4;
  uint uVar5;
  ulong uVar6;
  pointer puVar7;
  ulong uVar8;
  pointer pEVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  value_type_conflict1 local_1c;
  
  local_1c = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (fill,((long)(this->mPositions).
                         super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->mPositions).
                         super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333,
             &local_1c);
  pEVar9 = (this->mPositions).
           super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->mPositions).
      super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>.
      _M_impl.super__Vector_impl_data._M_finish == pEVar9) {
    uVar8 = 0;
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    uVar10 = 0;
    do {
      fVar13 = pEVar9[uVar10].mPosition.x;
      fVar14 = pEVar9[uVar10].mPosition.y;
      fVar15 = (this->mPlaneNormal).y;
      fVar16 = (this->mPlaneNormal).x;
      fVar2 = pEVar9[uVar10].mPosition.z;
      fVar3 = (this->mPlaneNormal).z;
      (fill->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start[pEVar9[uVar10].mIndex] = uVar5;
      uVar6 = uVar10 + 1;
      puVar7 = (fill->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (uVar6 < (ulong)((long)(fill->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar7 >> 2)) {
        fVar13 = fVar2 * fVar3 + fVar13 * fVar16 + fVar14 * fVar15 + pRadius;
        pEVar9 = (this->mPositions).
                 super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar11 = uVar10 * 0x14 + 0x24;
        do {
          pEVar4 = (this->mPositions).
                   super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pfVar1 = (float *)((long)&pEVar4->mIndex + lVar11);
          if ((fVar13 < *pfVar1 || fVar13 == *pfVar1) ||
             (fVar14 = *(float *)((long)pEVar4 + lVar11 + -0xc) - pEVar9[uVar10].mPosition.x,
             fVar15 = *(float *)((long)pEVar4 + lVar11 + -8) - pEVar9[uVar10].mPosition.y,
             fVar16 = *(float *)((long)pEVar4 + lVar11 + -4) - pEVar9[uVar10].mPosition.z,
             pRadius * pRadius <= fVar16 * fVar16 + fVar14 * fVar14 + fVar15 * fVar15)) break;
          puVar7[*(uint *)((long)pEVar4 + lVar11 + -0x10)] = uVar5;
          uVar6 = uVar6 + 1;
          puVar7 = (fill->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar11 = lVar11 + 0x14;
        } while (uVar6 < (ulong)((long)(fill->
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)puVar7 >>
                                2));
      }
      uVar5 = uVar5 + 1;
      pEVar9 = (this->mPositions).
               super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = ((long)(this->mPositions).
                     super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar9 >> 2) *
              -0x3333333333333333;
      uVar10 = uVar6;
    } while (uVar6 < uVar8);
  }
  puVar7 = (fill->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar11 = (long)(fill->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)puVar7;
  if (lVar11 != 0) {
    lVar11 = lVar11 >> 2;
    lVar12 = 0;
    do {
      if (uVar8 <= puVar7[lVar12]) {
        __assert_fail("fill[i]<mPositions.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/SpatialSort.cpp"
                      ,0x151,
                      "unsigned int Assimp::SpatialSort::GenerateMappingTable(std::vector<unsigned int> &, ai_real) const"
                     );
      }
      lVar12 = lVar12 + 1;
    } while (lVar11 + (ulong)(lVar11 == 0) != lVar12);
  }
  return uVar5;
}

Assistant:

unsigned int SpatialSort::GenerateMappingTable(std::vector<unsigned int>& fill, ai_real pRadius) const
{
    fill.resize(mPositions.size(),UINT_MAX);
    ai_real dist, maxDist;

    unsigned int t=0;
    const ai_real pSquared = pRadius*pRadius;
    for (size_t i = 0; i < mPositions.size();) {
        dist = mPositions[i].mPosition * mPlaneNormal;
        maxDist = dist + pRadius;

        fill[mPositions[i].mIndex] = t;
        const aiVector3D& oldpos = mPositions[i].mPosition;
        for (++i; i < fill.size() && mPositions[i].mDistance < maxDist
            && (mPositions[i].mPosition - oldpos).SquareLength() < pSquared; ++i)
        {
            fill[mPositions[i].mIndex] = t;
        }
        ++t;
    }

#ifdef ASSIMP_BUILD_DEBUG

    // debug invariant: mPositions[i].mIndex values must range from 0 to mPositions.size()-1
    for (size_t i = 0; i < fill.size(); ++i) {
        ai_assert(fill[i]<mPositions.size());
    }

#endif
    return t;
}